

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O2

int b_lshift(lua_State *L)

{
  lua_Unsigned r;
  lua_Integer lVar1;
  
  r = luaL_checkunsigned(L,1);
  lVar1 = luaL_checkinteger(L,2);
  b_shift(L,r,(int)lVar1);
  return 1;
}

Assistant:

static int b_lshift (lua_State *L) {
  return b_shift(L, luaL_checkunsigned(L, 1), luaL_checkint(L, 2));
}